

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O1

int dwarf_get_rnglist_offset_index_value
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned offsetentry_index,
              Dwarf_Unsigned *offset_value_out,Dwarf_Unsigned *global_offset_value_out,
              Dwarf_Error *error)

{
  Dwarf_Rnglists_Context pDVar1;
  char *pcVar2;
  ulong uVar3;
  dwarfstring m;
  dwarfstring_s local_50;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar2 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_rnglist_offset_index_value()either null or it containsa stale Dwarf_Debug pointer"
    ;
  }
  else {
    if (dbg->de_rnglists_context == (Dwarf_Rnglists_Context *)0x0) {
      return -1;
    }
    if (dbg->de_rnglists_context_count <= context_index) {
      return -1;
    }
    pDVar1 = dbg->de_rnglists_context[context_index];
    if (pDVar1->rc_magic == 0xabcd) {
      if (pDVar1->rc_offset_entry_count <= offsetentry_index) {
        return -1;
      }
      uVar3 = (ulong)pDVar1->rc_offset_size;
      if (pDVar1->rc_past_last_rnglist_offset <
          uVar3 * offsetentry_index + uVar3 + pDVar1->rc_offsets_off_in_sect) {
        dwarfstring_constructor(&local_50);
        dwarfstring_append_printf_u
                  (&local_50,
                   "DW_DLE_RNGLISTS_ERROR dwarf_get_rnglist_offset_index_value()  Offset for index %u is too large. "
                   ,offsetentry_index);
        pcVar2 = dwarfstring_string(&local_50);
        _dwarf_error_string(dbg,error,0x1d4,pcVar2);
        dwarfstring_destructor(&local_50);
        return 1;
      }
      local_50.s_data = (char *)0x0;
      if (pDVar1->rc_endaddr < pDVar1->rc_offsets_array + uVar3 * offsetentry_index + uVar3) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (*dbg->de_copy_word)(&local_50,pDVar1->rc_offsets_array + uVar3 * offsetentry_index,uVar3);
      if (offset_value_out != (Dwarf_Unsigned *)0x0) {
        *offset_value_out = (Dwarf_Unsigned)local_50.s_data;
      }
      if (global_offset_value_out == (Dwarf_Unsigned *)0x0) {
        return 0;
      }
      *global_offset_value_out = (Dwarf_Unsigned)(local_50.s_data + pDVar1->rc_offsets_off_in_sect);
      return 0;
    }
    pcVar2 = "DW_DLE_DBG_NULL rnglists context magic wrong not RNGLISTS_MAGIC";
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,pcVar2);
  return 1;
}

Assistant:

int
dwarf_get_rnglist_offset_index_value(
    Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned offsetentry_index,
    Dwarf_Unsigned * offset_value_out,
    Dwarf_Unsigned * global_offset_value_out,
    Dwarf_Error *error)
{
    Dwarf_Rnglists_Context con = 0;
    unsigned offset_len = 0;
    Dwarf_Small *offsetptr = 0;
    Dwarf_Unsigned targetoffset = 0;
    Dwarf_Unsigned localoffset = 0;

    CHECK_DBG(dbg,error,"dwarf_get_rnglist_offset_index_value()");
    if (!dbg->de_rnglists_context) {
        return DW_DLV_NO_ENTRY;
    }

    if (!dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (context_index >= dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_rnglists_context[context_index];
    if (con->rc_magic != RNGLISTS_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL "
            "rnglists context magic wrong "
            "not RNGLISTS_MAGIC");
        return DW_DLV_ERROR;
    }
    if (offsetentry_index >= con->rc_offset_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    offset_len  = con->rc_offset_size;
    localoffset = offsetentry_index*offset_len;
    offsetptr   = con->rc_offsets_array + localoffset;
    if ((con->rc_offsets_off_in_sect +localoffset +
        offset_len) >
        con->rc_past_last_rnglist_offset) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR "
            "dwarf_get_rnglist_offset_index_value() "
            " Offset for index %u is too large. ",
            offsetentry_index);
        _dwarf_error_string(dbg, error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;

    }
    READ_UNALIGNED_CK(dbg,targetoffset,Dwarf_Unsigned,
        offsetptr,
        offset_len,error,con->rc_endaddr);
    if (offset_value_out) {
        *offset_value_out = targetoffset;
    }
    if (global_offset_value_out) {
        *global_offset_value_out = targetoffset +
            con->rc_offsets_off_in_sect;
    }
    return DW_DLV_OK;
}